

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  TrackerContext *pTVar1;
  ITracker *pIVar2;
  
  this->m_runState = Failed;
  if (this->m_parent == (ITracker *)0x0) {
    pIVar2 = (ITracker *)0x0;
  }
  else {
    (*(this->m_parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[0xc])();
    pIVar2 = this->m_parent;
  }
  pTVar1 = this->m_ctx;
  pTVar1->m_currentTracker = pIVar2;
  pTVar1->m_runState = CompletedCycle;
  return;
}

Assistant:

virtual void fail() CATCH_OVERRIDE {
            m_runState = Failed;
            if( m_parent )
                m_parent->markAsNeedingAnotherRun();
            moveToParent();
            m_ctx.completeCycle();
        }